

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937sampler.hpp
# Opt level: O0

vec3f __thiscall MT19937Sampler::sampleUnitSphereSurface(MT19937Sampler *this)

{
  bool bVar1;
  undefined8 *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  vec3f vVar5;
  vec3f v;
  vec3f *in_stack_ffffffffffffffb0;
  vec3f local_30;
  vec3f local_24 [3];
  
  vec3f::vec3f(local_24);
  do {
    fVar2 = (float)(**(code **)*in_RDI)();
    fVar3 = (float)(**(code **)*in_RDI)();
    fVar4 = (float)(**(code **)*in_RDI)();
    vec3f::vec3f(&local_30,fVar2 + fVar2 + -1.0,fVar3 + fVar3 + -1.0,fVar4 + fVar4 + -1.0);
    local_24[0].x = local_30.x;
    local_24[0].y = local_30.y;
    local_24[0].z = local_30.z;
    fVar2 = norm((vec3f *)0x142c1c);
    bVar1 = true;
    if (fVar2 <= 1.0) {
      fVar2 = norm((vec3f *)0x142c39);
      bVar1 = fVar2 < 0.001;
    }
  } while (bVar1);
  vVar5 = normalized(in_stack_ffffffffffffffb0);
  return vVar5;
}

Assistant:

vec3f sampleUnitSphereSurface() {
		// TODO optimize
		vec3f v;
		do v = vec3f(get1f()*2-1, get1f()*2-1, get1f()*2-1);
		while (norm(v)>1 || norm(v)<1e-3);
		return normalized(v);
	}